

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O1

void __thiscall
cmInstallRuntimeDependencySetGenerator::cmInstallRuntimeDependencySetGenerator
          (cmInstallRuntimeDependencySetGenerator *this,DependencyType type,
          cmInstallRuntimeDependencySet *dependencySet,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *installRPaths,bool noInstallRPath,string *installNameDir,bool noInstallName,char *depsVar
          ,char *rpathPrefix,char *tmpVarPrefix,string destination,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,string component,string permissions,MessageLevel message,
          bool exclude_from_all,cmListFileBacktrace backtrace)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  undefined8 uVar5;
  string local_80;
  string local_60;
  cmListFileBacktrace local_40;
  
  psVar1 = (size_type *)(destination._M_dataplus._M_p + 0x10);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)destination._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_80.field_2._M_allocated_capacity = *psVar1;
    local_80.field_2._8_8_ = *(undefined8 *)(destination._M_dataplus._M_p + 0x18);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  }
  else {
    local_80.field_2._M_allocated_capacity = *psVar1;
    local_80._M_dataplus._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)destination._M_dataplus._M_p;
  }
  local_80._M_string_length = *(size_type *)(destination._M_dataplus._M_p + 8);
  *(size_type **)destination._M_dataplus._M_p = psVar1;
  destination._M_dataplus._M_p[8] = '\0';
  destination._M_dataplus._M_p[9] = '\0';
  destination._M_dataplus._M_p[10] = '\0';
  destination._M_dataplus._M_p[0xb] = '\0';
  destination._M_dataplus._M_p[0xc] = '\0';
  destination._M_dataplus._M_p[0xd] = '\0';
  destination._M_dataplus._M_p[0xe] = '\0';
  destination._M_dataplus._M_p[0xf] = '\0';
  destination._M_dataplus._M_p[0x10] = '\0';
  psVar1 = (size_type *)(destination.field_2._M_allocated_capacity + 0x10);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)destination.field_2._M_allocated_capacity ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_60.field_2._M_allocated_capacity = *psVar1;
    local_60.field_2._8_8_ = *(undefined8 *)(destination.field_2._M_allocated_capacity + 0x18);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar1;
    local_60._M_dataplus._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)destination.field_2._M_allocated_capacity;
  }
  local_60._M_string_length = *(size_type *)(destination.field_2._M_allocated_capacity + 8);
  *(size_type **)destination.field_2._M_allocated_capacity = psVar1;
  *(undefined8 *)(destination.field_2._M_allocated_capacity + 8) = 0;
  *(undefined1 *)(destination.field_2._M_allocated_capacity + 0x10) = 0;
  local_40.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = *(element_type **)component._M_string_length;
  local_40.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(component._M_string_length + 8);
  *(undefined8 *)(component._M_string_length + 8) = 0;
  *(undefined8 *)component._M_string_length = 0;
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,&local_80,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)destination._M_string_length,&local_60,(MessageLevel)configurations,
             component._M_dataplus._M_p._0_1_,false,&local_40);
  if (local_40.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallRuntimeDependencySetGenerator_009681d8;
  this->Type = type;
  this->DependencySet = dependencySet;
  (this->InstallRPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (installRPaths->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->InstallRPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (installRPaths->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->InstallRPaths).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (installRPaths->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (installRPaths->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (installRPaths->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (installRPaths->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->NoInstallRPath = noInstallRPath;
  paVar3 = &(this->InstallNameDir).field_2;
  (this->InstallNameDir)._M_dataplus._M_p = (pointer)paVar3;
  pcVar4 = (installNameDir->_M_dataplus)._M_p;
  paVar2 = &installNameDir->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&installNameDir->field_2 + 8);
    paVar3->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->InstallNameDir).field_2 + 8) = uVar5;
  }
  else {
    (this->InstallNameDir)._M_dataplus._M_p = pcVar4;
    (this->InstallNameDir).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->InstallNameDir)._M_string_length = installNameDir->_M_string_length;
  (installNameDir->_M_dataplus)._M_p = (pointer)paVar2;
  installNameDir->_M_string_length = 0;
  (installNameDir->field_2)._M_local_buf[0] = '\0';
  this->NoInstallName = noInstallName;
  paVar2 = &(this->Permissions).field_2;
  (this->Permissions)._M_dataplus._M_p = (pointer)paVar2;
  psVar1 = (size_type *)(destination.field_2._8_8_ + 0x10);
  if (*(size_type **)destination.field_2._8_8_ == psVar1) {
    uVar5 = *(undefined8 *)(destination.field_2._8_8_ + 0x18);
    paVar2->_M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&(this->Permissions).field_2 + 8) = uVar5;
  }
  else {
    (this->Permissions)._M_dataplus._M_p = (pointer)*(size_type **)destination.field_2._8_8_;
    (this->Permissions).field_2._M_allocated_capacity = *psVar1;
  }
  (this->Permissions)._M_string_length = *(size_type *)(destination.field_2._8_8_ + 8);
  *(size_type **)destination.field_2._8_8_ = psVar1;
  *(undefined8 *)(destination.field_2._8_8_ + 8) = 0;
  *(undefined1 *)(destination.field_2._8_8_ + 0x10) = 0;
  this->DepsVar = depsVar;
  this->RPathPrefix = rpathPrefix;
  this->TmpVarPrefix = tmpVarPrefix;
  this->LocalGenerator = (cmLocalGenerator *)0x0;
  (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
  return;
}

Assistant:

cmInstallRuntimeDependencySetGenerator::cmInstallRuntimeDependencySetGenerator(
  DependencyType type, cmInstallRuntimeDependencySet* dependencySet,
  std::vector<std::string> installRPaths, bool noInstallRPath,
  std::string installNameDir, bool noInstallName, const char* depsVar,
  const char* rpathPrefix, const char* tmpVarPrefix, std::string destination,
  std::vector<std::string> const& configurations, std::string component,
  std::string permissions, MessageLevel message, bool exclude_from_all,
  cmListFileBacktrace backtrace)
  : cmInstallGenerator(std::move(destination), configurations,
                       std::move(component), message, exclude_from_all, false,
                       std::move(backtrace))
  , Type(type)
  , DependencySet(dependencySet)
  , InstallRPaths(std::move(installRPaths))
  , NoInstallRPath(noInstallRPath)
  , InstallNameDir(std::move(installNameDir))
  , NoInstallName(noInstallName)
  , Permissions(std::move(permissions))
  , DepsVar(depsVar)
  , RPathPrefix(rpathPrefix)
  , TmpVarPrefix(tmpVarPrefix)
{
  this->ActionsPerConfig = true;
}